

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O1

Pipeline * __thiscall
capnp::AnyPointer::Pipeline::noop(Pipeline *__return_storage_ptr__,Pipeline *this)

{
  size_t elementCount;
  size_t sVar1;
  PipelineOp *pPVar2;
  unsigned_long i;
  size_t sVar3;
  Array<capnp::PipelineOp> newOps;
  Disposer *local_28;
  PipelineHook *local_20;
  
  elementCount = (this->ops).size_;
  pPVar2 = (PipelineOp *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  sVar1 = (this->ops).size_;
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      pPVar2[sVar3] = (this->ops).ptr[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  (**((this->hook).ptr)->_vptr_PipelineHook)(&local_28);
  (__return_storage_ptr__->hook).disposer = local_28;
  (__return_storage_ptr__->hook).ptr = local_20;
  (__return_storage_ptr__->ops).ptr = pPVar2;
  (__return_storage_ptr__->ops).size_ = elementCount;
  (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline AnyPointer::Pipeline::noop() {
  auto newOps = kj::heapArray<PipelineOp>(ops.size());
  for (auto i: kj::indices(ops)) {
    newOps[i] = ops[i];
  }
  return Pipeline(hook->addRef(), kj::mv(newOps));
}